

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O1

void __thiscall BanMan::~BanMan(BanMan *this)

{
  long lVar1;
  pointer puVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DumpBanlist(this);
  puVar2 = (this->m_discouraged).data.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_discouraged).data.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  std::filesystem::__cxx11::path::~path(&(this->m_ban_db).m_banlist_json.super_path);
  std::filesystem::__cxx11::path::~path((path *)&this->m_ban_db);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::
    _Rb_tree<CSubNet,_std::pair<const_CSubNet,_CBanEntry>,_std::_Select1st<std::pair<const_CSubNet,_CBanEntry>_>,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
    ::~_Rb_tree(&(this->m_banned)._M_t);
    return;
  }
  __stack_chk_fail();
}

Assistant:

BanMan::~BanMan()
{
    DumpBanlist();
}